

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-utils.h
# Opt level: O0

int ctz32(uint32_t val)

{
  undefined4 local_10;
  uint32_t val_local;
  
  if (val == 0) {
    local_10 = 0x20;
  }
  else {
    local_10 = 0;
    for (; (val & 1) == 0; val = val >> 1 | 0x80000000) {
      local_10 = local_10 + 1;
    }
  }
  return local_10;
}

Assistant:

static inline int ctz32(uint32_t val)
{
#ifndef _MSC_VER
    return val ? __builtin_ctz(val) : 32;
#else
    /* Binary search for the trailing one bit.  */
    int cnt;

    cnt = 0;
    if (!(val & 0x0000FFFFUL)) {
        cnt += 16;
        val >>= 16;
    }
    if (!(val & 0x000000FFUL)) {
        cnt += 8;
        val >>= 8;
    }
    if (!(val & 0x0000000FUL)) {
        cnt += 4;
        val >>= 4;
    }
    if (!(val & 0x00000003UL)) {
        cnt += 2;
        val >>= 2;
    }
    if (!(val & 0x00000001UL)) {
        cnt++;
        val >>= 1;
    }
    if (!(val & 0x00000001UL)) {
        cnt++;
    }

    return cnt;
#endif
}